

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O2

QString * __thiscall
QFileSystemModelPrivate::filePath
          (QString *__return_storage_ptr__,QFileSystemModelPrivate *this,QModelIndex *index)

{
  QAbstractItemModel *pQVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  bool bVar4;
  QFileSystemNode *args;
  QChar *pQVar5;
  long in_FS_OFFSET;
  Data *local_88;
  char16_t *pcStack_80;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_78;
  Data *local_68;
  char16_t *pcStack_60;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_58;
  QArrayDataPointer<QString> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = QModelIndex::isValid(index);
  if (bVar4) {
    local_48.size = 0;
    local_48.d = (Data *)0x0;
    local_48.ptr = (QString *)0x0;
    local_68 = *(Data **)index;
    pcStack_60 = (char16_t *)index->i;
    local_58.ptr = (index->m).ptr;
    while (((-1 < (int)local_68 && (-1 < (long)local_68)) &&
           (local_58.ptr != (QAbstractItemModel *)0x0))) {
      args = node(this,(QModelIndex *)&local_68);
      if (args != (QFileSystemNode *)0x0) {
        QList<QString>::emplaceFront<QString_const&>((QList<QString> *)&local_48,&args->fileName);
      }
      QModelIndex::parent((QModelIndex *)&local_88,(QModelIndex *)&local_68);
      local_68 = local_88;
      pcStack_60 = pcStack_80;
      local_58.ptr = local_78.ptr;
    }
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QListSpecialMethods<QString>::join
              ((QString *)&local_88,(QListSpecialMethods<QString> *)&local_48,(QChar)0x2f);
    QDir::fromNativeSeparators((QString *)__return_storage_ptr__);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
    if (2 < (ulong)(__return_storage_ptr__->d).size) {
      pQVar5 = QString::data(__return_storage_ptr__);
      if (pQVar5->ucs == L'/') {
        pQVar5 = QString::data(__return_storage_ptr__);
        if (pQVar5[1].ucs == L'/') {
          QString::mid((longlong)&local_88,(longlong)__return_storage_ptr__);
          pDVar2 = (__return_storage_ptr__->d).d;
          pcVar3 = (__return_storage_ptr__->d).ptr;
          (__return_storage_ptr__->d).d = local_88;
          (__return_storage_ptr__->d).ptr = pcStack_80;
          pQVar1 = (QAbstractItemModel *)(__return_storage_ptr__->d).size;
          (__return_storage_ptr__->d).size = (qsizetype)local_78.ptr;
          local_88 = pDVar2;
          pcStack_80 = pcVar3;
          local_78.ptr = pQVar1;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
        }
      }
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
LAB_0056d780:
      __stack_chk_fail();
    }
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_30) goto LAB_0056d780;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

QString QFileSystemModelPrivate::filePath(const QModelIndex &index) const
{
    Q_Q(const QFileSystemModel);
    Q_UNUSED(q);
    if (!index.isValid())
        return QString();
    Q_ASSERT(index.model() == q);

    QStringList path;
    QModelIndex idx = index;
    while (idx.isValid()) {
        QFileSystemModelPrivate::QFileSystemNode *dirNode = node(idx);
        if (dirNode)
            path.prepend(dirNode->fileName);
        idx = idx.parent();
    }
    QString fullPath = QDir::fromNativeSeparators(path.join(QDir::separator()));
#if !defined(Q_OS_WIN)
    if ((fullPath.size() > 2) && fullPath[0] == u'/' && fullPath[1] == u'/')
        fullPath = fullPath.mid(1);
#else
    if (fullPath.length() == 2 && fullPath.endsWith(u':'))
        fullPath.append(u'/');
#endif
    return fullPath;
}